

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siamese.cpp
# Opt level: O0

SiameseResult siamese_decoder_is_ready(SiameseDecoder decoder_t)

{
  bool bVar1;
  long in_RDI;
  Decoder *decoder;
  Decoder *in_stack_00000078;
  SiameseResult local_4;
  
  if (in_RDI != 0) {
    if (((*(byte *)(in_RDI + 0x790) & 1) != 0) ||
       (bVar1 = siamese::Decoder::CheckRecoveryPossible(in_stack_00000078), bVar1)) {
      local_4 = Siamese_Success;
    }
    else {
      local_4 = Siamese_NeedMoreData;
    }
    return local_4;
  }
  return Siamese_InvalidInput;
}

Assistant:

SIAMESE_EXPORT SiameseResult siamese_decoder_is_ready(
    SiameseDecoder decoder_t)
{
    siamese::Decoder* decoder = reinterpret_cast<siamese::Decoder*>(decoder_t);
    if (!decoder)
        return Siamese_InvalidInput;

    return decoder->IsReadyToDecode();
}